

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

ostream * opts::operator<<(ostream *out,Options *ops)

{
  bool bVar1;
  int iVar2;
  const_iterator this;
  const_iterator out_00;
  long in_RSI;
  ostream *in_RDI;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *cur_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *__range2_1;
  int cur_long;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *cur;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *__range2;
  int max_long;
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *in_stack_ffffffffffffff98;
  BasicOption *in_stack_ffffffffffffffa0;
  _Self local_30;
  _Self local_28;
  long local_20;
  int local_14;
  ostream *local_8;
  
  local_14 = 0;
  local_20 = in_RSI + 0x18;
  local_8 = in_RDI;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::
    _List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
    ::operator*((_List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
                 *)in_stack_ffffffffffffffa0);
    std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::operator->
              ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)0x117b20);
    iVar2 = BasicOption::long_size(in_stack_ffffffffffffffa0);
    if (local_14 < iVar2) {
      local_14 = iVar2;
    }
    std::
    _List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
    ::operator++(&local_28);
  }
  std::operator<<(local_8,"Options:\n");
  this = std::__cxx11::
         list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
         ::begin(in_stack_ffffffffffffff98);
  out_00 = std::__cxx11::
           list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
           ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb0,(_Self *)&stack0xffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (BasicOption *)
         std::
         _List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
         ::operator*((_List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
                      *)in_stack_ffffffffffffffa0);
    std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::operator->
              ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)0x117bb7);
    BasicOption::output((BasicOption *)this._M_node,(ostream *)out_00._M_node,
                        (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    std::
    _List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
    ::operator++((_List_const_iterator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>
                  *)&stack0xffffffffffffffb0);
  }
  return local_8;
}

Assistant:

std::ostream&
    operator<<(std::ostream& out, const Options& ops)
    {
        int max_long = 0;
        for (auto& cur : ops.options)
        {
            int cur_long = cur->long_size();
            if (cur_long > max_long)
                max_long = cur_long;
        }

        out << "Options:\n";
        for (auto& cur : ops.options)
            cur->output(out, max_long);

        return out;
    }